

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

FullLocation * __thiscall
slang::BumpAllocator::emplace<slang::parsing::Trivia::FullLocation>(BumpAllocator *this)

{
  FullLocation *pFVar1;
  
  pFVar1 = (FullLocation *)((ulong)(this->head->current + 3) & 0xfffffffffffffffc);
  if ((FullLocation *)this->endPtr < pFVar1 + 1) {
    pFVar1 = (FullLocation *)allocateSlow(this,0x18,4);
  }
  else {
    this->head->current = (byte *)(pFVar1 + 1);
  }
  (pFVar1->text)._M_len = 0;
  (pFVar1->text)._M_str = (char *)0x0;
  pFVar1->location = (SourceLocation)0x0;
  return pFVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }